

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void Randomize(Mat *m,float a,float b)

{
  uint64_t uVar1;
  prng_rand_t *state;
  size_t i;
  ulong uVar2;
  
  state = (prng_rand_t *)m;
  for (uVar2 = 0; uVar2 < (long)m->c * m->cstep; uVar2 = uVar2 + 1) {
    uVar1 = prng_rand(state);
    *(float *)((long)m->data + uVar2 * 4) = (float)uVar1 * 5.421011e-20 * 4.0 + -2.0;
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -2.f, float b = 2.f)
{
    for (size_t i=0; i<m.total(); i++)
    {
        m[i] = RandomFloat(a, b);
    }
}